

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void getsec_(PDISASM pMyDisasm)

{
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    if (((((pMyDisasm->Prefix).RepnePrefix == '\x02') || ((pMyDisasm->Prefix).RepPrefix == '\x02'))
        || ((pMyDisasm->Prefix).OperandSize == '\x01')) ||
       ((pMyDisasm->Prefix).LockPrefix == '\x04')) {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    (pMyDisasm->Instruction).Category = 0x10000;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"getsec",7);
    (pMyDisasm->Operand1).OpType = 0x20000;
    (pMyDisasm->Operand1).Registers.type = 1;
    (pMyDisasm->Operand1).Registers.gpr = 1;
    (pMyDisasm->Operand1).OpSize = 0x40;
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ getsec_(PDISASM pMyDisasm)
{
  if (GV.VEX.state != InUsePrefix) {
    if (
      (pMyDisasm->Prefix.RepnePrefix == SuperfluousPrefix) ||
      (pMyDisasm->Prefix.RepPrefix == SuperfluousPrefix) ||
      (pMyDisasm->Prefix.OperandSize == InUsePrefix) ||
      (pMyDisasm->Prefix.LockPrefix == InvalidPrefix)
    ) {
      GV.ERROR_OPCODE = UD_;
    }
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "getsec");
    #endif
    pMyDisasm->Operand1.OpType = REGISTER_TYPE;
    pMyDisasm->Operand1.Registers.type = GENERAL_REG;
    pMyDisasm->Operand1.Registers.gpr = REG0;
    pMyDisasm->Operand1.OpSize = 64;
  }
  else {
    failDecode(pMyDisasm);
  }
}